

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O3

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::~COpenGLCoreTexture
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this)

{
  COpenGLCoreTexture<irr::video::COpenGLDriver> *this_00;
  
  this_00 = (COpenGLCoreTexture<irr::video::COpenGLDriver> *)
            ((long)&(this->super_ITexture)._vptr_ITexture +
            (long)(this->super_ITexture)._vptr_ITexture[-3]);
  ~COpenGLCoreTexture(this_00,&VTT);
  operator_delete(this_00,0x108);
  return;
}

Assistant:

virtual ~COpenGLCoreTexture()
	{
		if (TextureName)
			GL.DeleteTextures(1, &TextureName);

		if (LockImage)
			LockImage->drop();

		for (u32 i = 0; i < Images.size(); ++i)
			Images[i]->drop();
	}